

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

long duckdb::TryCastCInternal<float,long,duckdb::TryCast>(duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  long in_RAX;
  long result_value;
  long local_8;
  
  local_8 = in_RAX;
  bVar1 = TryCast::Operation<float,long>
                    (*(float *)((long)result->deprecated_columns[col].deprecated_data + row * 4),
                     &local_8,false);
  if (!bVar1) {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}